

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall hdc::Lex::getNextToken(Lex *this)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  ostream *poVar4;
  Lex *this_local;
  
  bVar1 = lookahead(this,'\n');
  if (bVar1) {
    if (((this->newline & 1U) == 0) &&
       (sVar2 = std::
                stack<hdc::TokenKind,_std::deque<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>_>
                ::size(&this->blockStack), sVar2 == 0)) {
      createToken(this,TK_NEWLINE);
    }
    advance(this);
  }
  else {
    bVar1 = lookahead(this,'#');
    if (bVar1) {
      skipComment(this);
    }
    else if ((this->newline & 1U) == 0) {
      bVar1 = lookahead(this,' ');
      if (bVar1) {
        skipWhitespace(this);
      }
      else {
        bVar1 = lookahead(this,'\"');
        if (bVar1) {
          getDoubleQuoteString(this);
        }
        else {
          bVar1 = lookahead(this,'\'');
          if (bVar1) {
            getSingleQuoteString(this);
          }
          else {
            bVar1 = isDigit(this);
            if (bVar1) {
              getNumber(this);
            }
            else {
              bVar1 = isAlpha(this);
              if (bVar1) {
                getKeywordOrIdentifier(this);
              }
              else {
                bVar1 = isOperator(this);
                if (bVar1) {
                  getOperator(this);
                }
                else {
                  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&this->buffer);
                  poVar4 = std::operator<<((ostream *)&std::cout,*pcVar3);
                  std::operator<<(poVar4,"\n");
                }
              }
            }
          }
        }
      }
    }
    else {
      getIndentation(this);
    }
  }
  return;
}

Assistant:

void Lex::getNextToken() {
    if (lookahead('\n')) {
        if (!newline && blockStack.size() == 0) {
            createToken(TK_NEWLINE);
        }

        advance();
    } else if (lookahead('#')) {
        skipComment();
    } else if (newline) {
        getIndentation();
    } else if (lookahead(' ')) {
        skipWhitespace();
    } else if (lookahead('"')) {
        getDoubleQuoteString();
    } else if (lookahead('\'')) {
        getSingleQuoteString();
    } else if (isDigit()) {
        getNumber();
    } else if (isAlpha()) {
        getKeywordOrIdentifier();
    } else if (isOperator()) {
        getOperator();
    } else {
        std::cout << buffer[idx] << "\n";
    }
}